

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
diligent_spirv_cross::CompilerGLSL::for_loop_initializers_are_same_type
          (CompilerGLSL *this,SPIRBlock *block)

{
  bool bVar1;
  uint32_t uVar2;
  Types TVar3;
  uint32_t uVar4;
  size_t sVar5;
  SPIRVariable *pSVar6;
  Variant *this_00;
  Bitset *pBVar7;
  ID local_a8;
  undefined4 local_a4;
  ID local_a0 [5];
  uint32_t local_8c;
  TypedID *pTStack_88;
  uint32_t expr;
  TypedID<(diligent_spirv_cross::Types)2> *var;
  TypedID<(diligent_spirv_cross::Types)2> *__end1;
  TypedID<(diligent_spirv_cross::Types)2> *__begin1;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,_8UL> *__range1;
  Bitset expected_flags;
  uint32_t expected;
  SPIRBlock *block_local;
  CompilerGLSL *this_local;
  
  sVar5 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::size
                    (&(block->loop_variables).
                      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                    );
  if (sVar5 < 2) {
    this_local._7_1_ = true;
  }
  else {
    expected_flags.higher._M_h._M_single_bucket._4_4_ = 0;
    Bitset::Bitset((Bitset *)&__range1);
    __begin1 = (TypedID<(diligent_spirv_cross::Types)2> *)&block->loop_variables;
    __end1 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::begin
                       ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>
                         *)__begin1);
    var = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_>::end
                    ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>_> *)
                     __begin1);
    for (; __end1 != var; __end1 = __end1 + 1) {
      pTStack_88 = (TypedID *)__end1;
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
      pSVar6 = Compiler::get<diligent_spirv_cross::SPIRVariable>(&this->super_Compiler,uVar2);
      local_8c = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar6->static_expression);
      if (local_8c != 0) {
        this_00 = VectorView<diligent_spirv_cross::Variant>::operator[]
                            (&(this->super_Compiler).ir.ids.
                              super_VectorView<diligent_spirv_cross::Variant>,(ulong)local_8c);
        TVar3 = Variant::get_type(this_00);
        uVar2 = expected_flags.higher._M_h._M_single_bucket._4_4_;
        if (TVar3 != TypeUndef) {
          if (expected_flags.higher._M_h._M_single_bucket._4_4_ == 0) {
            uVar2 = TypedID::operator_cast_to_unsigned_int(pTStack_88);
            pSVar6 = Compiler::get<diligent_spirv_cross::SPIRVariable>(&this->super_Compiler,uVar2);
            expected_flags.higher._M_h._M_single_bucket._4_4_ =
                 TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)&(pSVar6->super_IVariant).field_0xc);
            TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)2>
                      (local_a0,(TypedID<(diligent_spirv_cross::Types)2> *)pTStack_88);
            pBVar7 = Compiler::get_decoration_bitset(&this->super_Compiler,local_a0[0]);
            Bitset::operator=((Bitset *)&__range1,pBVar7);
          }
          else {
            uVar4 = TypedID::operator_cast_to_unsigned_int(pTStack_88);
            pSVar6 = Compiler::get<diligent_spirv_cross::SPIRVariable>(&this->super_Compiler,uVar4);
            uVar4 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar6->super_IVariant).field_0xc);
            if (uVar2 != uVar4) {
              this_local._7_1_ = false;
              goto LAB_00d36108;
            }
          }
          TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)2>
                    (&local_a8,(TypedID<(diligent_spirv_cross::Types)2> *)pTStack_88);
          pBVar7 = Compiler::get_decoration_bitset(&this->super_Compiler,local_a8);
          bVar1 = Bitset::operator!=((Bitset *)&__range1,pBVar7);
          if (bVar1) {
            this_local._7_1_ = false;
            goto LAB_00d36108;
          }
        }
      }
    }
    this_local._7_1_ = true;
LAB_00d36108:
    local_a4 = 1;
    Bitset::~Bitset((Bitset *)&__range1);
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::for_loop_initializers_are_same_type(const SPIRBlock &block)
{
	if (block.loop_variables.size() <= 1)
		return true;

	uint32_t expected = 0;
	Bitset expected_flags;
	for (auto &var : block.loop_variables)
	{
		// Don't care about uninitialized variables as they will not be part of the initializers.
		uint32_t expr = get<SPIRVariable>(var).static_expression;
		if (expr == 0 || ir.ids[expr].get_type() == TypeUndef)
			continue;

		if (expected == 0)
		{
			expected = get<SPIRVariable>(var).basetype;
			expected_flags = get_decoration_bitset(var);
		}
		else if (expected != get<SPIRVariable>(var).basetype)
			return false;

		// Precision flags and things like that must also match.
		if (expected_flags != get_decoration_bitset(var))
			return false;
	}

	return true;
}